

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lstate.c
# Opt level: O0

lua_State * lua_newthread(lua_State *L)

{
  StkId pTVar1;
  GCObject *L_00;
  TValue *io;
  lua_State *L1;
  lua_State *L_local;
  
  if (0 < L->l_G->GCdebt) {
    luaC_step(L);
  }
  L_00 = luaC_newobj(L,8,0xd0,(GCObject **)0x0,0);
  pTVar1 = L->top;
  (pTVar1->value_).f = (lua_CFunction)L_00;
  pTVar1->tt_ = 0x48;
  L->top = L->top + 1;
  preinit_state(&L_00->th,L->l_G);
  (L_00->th).hookmask = L->hookmask;
  (L_00->th).basehookcount = L->basehookcount;
  (L_00->th).hook = L->hook;
  (L_00->p).sizeupvalues = (L_00->th).basehookcount;
  stack_init(&L_00->th,L);
  return (lua_State *)L_00;
}

Assistant:

LUA_API lua_State *lua_newthread (lua_State *L) {
  lua_State *L1;
  lua_lock(L);
  luaC_checkGC(L);
  L1 = &luaC_newobj(L, LUA_TTHREAD, sizeof(LX), NULL, offsetof(LX, l))->th;
  setthvalue(L, L->top, L1);
  api_incr_top(L);
  preinit_state(L1, G(L));
  L1->hookmask = L->hookmask;
  L1->basehookcount = L->basehookcount;
  L1->hook = L->hook;
  resethookcount(L1);
  luai_userstatethread(L, L1);
  stack_init(L1, L);  /* init stack */
  lua_unlock(L);
  return L1;
}